

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this)

{
  ResultBuilder *pRVar1;
  long in_RDI;
  bool value;
  string *in_stack_ffffffffffffff98;
  ResultBuilder *in_stack_ffffffffffffffa0;
  bool in_stack_ffffffffffffffcf;
  string local_30 [39];
  byte local_9;
  
  local_9 = *(byte *)(in_RDI + 8) & 1;
  Catch::toString_abi_cxx11_(in_stack_ffffffffffffffcf);
  pRVar1 = ResultBuilder::setLhs(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pRVar1 = ResultBuilder::setResultType(pRVar1,(bool)(local_9 & 1));
  ResultBuilder::endExpression(pRVar1);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }